

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOptimizedPixelReading.h
# Opt level: O2

void Imf_2_5::optimizedWriteToRGBA
               (unsigned_short **readPtrRed,unsigned_short **readPtrGreen,
               unsigned_short **readPtrBlue,unsigned_short **readPtrAlpha,unsigned_short **writePtr,
               size_t *pixelsToCopySSE,size_t *pixelsToCopyNormal)

{
  unsigned_short *puVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar2 = (ulong)*readPtrGreen | (ulong)*readPtrRed | (ulong)*readPtrBlue | (ulong)*readPtrAlpha;
  puVar1 = *writePtr;
  if (((ulong)puVar1 & 0xf) == 0 || (uVar2 & 0xf) == 0) {
    bVar3 = ((ulong)puVar1 & 0xf) == 0;
    if ((uVar2 & 0xf) != 0 && bVar3) {
      writeToRGBASSETemplate<false,true>
                ((__m128i **)readPtrRed,(__m128i **)readPtrGreen,(__m128i **)readPtrBlue,
                 (__m128i **)readPtrAlpha,(__m128i **)writePtr,pixelsToCopySSE);
    }
    else {
      bVar4 = (uVar2 & 0xf) != 0;
      if ((((ulong)puVar1 & 0xf) == 0) || (bVar4)) {
        if (!bVar4 && bVar3) {
          writeToRGBASSETemplate<true,true>
                    ((__m128i **)readPtrRed,(__m128i **)readPtrGreen,(__m128i **)readPtrBlue,
                     (__m128i **)readPtrAlpha,(__m128i **)writePtr,pixelsToCopySSE);
        }
      }
      else {
        writeToRGBASSETemplate<true,false>
                  ((__m128i **)readPtrRed,(__m128i **)readPtrGreen,(__m128i **)readPtrBlue,
                   (__m128i **)readPtrAlpha,(__m128i **)writePtr,pixelsToCopySSE);
      }
    }
  }
  else {
    writeToRGBASSETemplate<false,false>
              ((__m128i **)readPtrRed,(__m128i **)readPtrGreen,(__m128i **)readPtrBlue,
               (__m128i **)readPtrAlpha,(__m128i **)writePtr,pixelsToCopySSE);
  }
  writeToRGBANormal(readPtrRed,readPtrGreen,readPtrBlue,readPtrAlpha,writePtr,pixelsToCopyNormal);
  return;
}

Assistant:

EXR_FORCEINLINE 
void optimizedWriteToRGBA (unsigned short*& readPtrRed,
                           unsigned short*& readPtrGreen,
                           unsigned short*& readPtrBlue,
                           unsigned short*& readPtrAlpha,
                           unsigned short*& writePtr,
                           const size_t& pixelsToCopySSE,
                           const size_t& pixelsToCopyNormal)
{
    bool readPtrAreAligned = true;

    readPtrAreAligned &= isPointerSSEAligned(readPtrRed);
    readPtrAreAligned &= isPointerSSEAligned(readPtrGreen);
    readPtrAreAligned &= isPointerSSEAligned(readPtrBlue);
    readPtrAreAligned &= isPointerSSEAligned(readPtrAlpha);

    bool writePtrIsAligned = isPointerSSEAligned(writePtr);

    if (!readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBASSETemplate<false, false> ((__m128i*&)readPtrRed,
                                              (__m128i*&)readPtrGreen,
                                              (__m128i*&)readPtrBlue,
                                              (__m128i*&)readPtrAlpha,
                                              (__m128i*&)writePtr,
                                              pixelsToCopySSE);
    }
    else if (!readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBASSETemplate<false, true> ((__m128i*&)readPtrRed,
                                             (__m128i*&)readPtrGreen,
                                             (__m128i*&)readPtrBlue,
                                             (__m128i*&)readPtrAlpha,
                                             (__m128i*&)writePtr,
                                             pixelsToCopySSE);
    }
    else if (readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBASSETemplate<true, false> ((__m128i*&)readPtrRed,
                                             (__m128i*&)readPtrGreen,
                                             (__m128i*&)readPtrBlue,
                                             (__m128i*&)readPtrAlpha,
                                             (__m128i*&)writePtr,
                                             pixelsToCopySSE);
    }
    else if(readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBASSETemplate<true, true> ((__m128i*&)readPtrRed,
                                            (__m128i*&)readPtrGreen,
                                            (__m128i*&)readPtrBlue,
                                            (__m128i*&)readPtrAlpha,
                                            (__m128i*&)writePtr,
                                            pixelsToCopySSE);
    }

    writeToRGBANormal (readPtrRed, readPtrGreen, readPtrBlue, readPtrAlpha,
                       writePtr, pixelsToCopyNormal);
}